

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O0

int coda_expression_eval_integer(coda_expression *expr,coda_cursor_conflict *cursor,int64_t *value)

{
  int iVar1;
  undefined1 local_368 [8];
  eval_info info;
  int64_t *value_local;
  coda_cursor_conflict *cursor_local;
  coda_expression *expr_local;
  
  info.variable_name = (char *)value;
  if (expr->result_type == coda_expression_integer) {
    if ((cursor == (coda_cursor_conflict *)0x0) && (expr->is_constant == 0)) {
      coda_set_error(-100,"cursor argument may not be NULL if expression is not constant");
      expr_local._4_4_ = -1;
    }
    else {
      init_eval_info((eval_info *)local_368,cursor);
      iVar1 = eval_integer((eval_info *)local_368,expr,(int64_t *)info.variable_name);
      if (iVar1 == 0) {
        expr_local._4_4_ = 0;
      }
      else {
        if (cursor != (coda_cursor_conflict *)0x0) {
          iVar1 = coda_cursor_compare(cursor,(coda_cursor_conflict *)&info);
          if (iVar1 != 0) {
            coda_cursor_add_to_error_message((coda_cursor_conflict *)&info);
          }
        }
        expr_local._4_4_ = -1;
      }
    }
  }
  else {
    coda_set_error(-100,"expression is not an \'integer\' expression");
    expr_local._4_4_ = -1;
  }
  return expr_local._4_4_;
}

Assistant:

LIBCODA_API int coda_expression_eval_integer(const coda_expression *expr, const coda_cursor *cursor, int64_t *value)
{
    eval_info info;

    if (expr->result_type != coda_expression_integer)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not an 'integer' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    if (eval_integer(&info, expr, value) != 0)
    {
        if (cursor != NULL && coda_cursor_compare(cursor, &info.cursor) != 0)
        {
            coda_cursor_add_to_error_message(&info.cursor);
        }
        return -1;
    }

    return 0;
}